

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_refresh(OpenJTalk *oj)

{
  OpenJTalk *in_RDI;
  
  if (in_RDI == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    openjtalk_stop((OpenJTalk *)0x19a074);
    if ((g_psd != (SpeakData *)0x0) && (g_psd->data != (short *)0x0)) {
      free(g_psd->data);
      g_psd->data = (short *)0x0;
    }
    Open_JTalk_refresh((Open_JTalk *)0x19a0c0);
    JTalkData_initialize(in_RDI);
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_refresh(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}
	openjtalk_stop(oj);

	if (g_psd != NULL && g_psd->data)
	{
		free(g_psd->data);
		g_psd->data = NULL;
	}

	Open_JTalk_refresh(oj->open_jtalk);

	if (!JTalkData_initialize(oj))
	{
		return;
	}
}